

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint64_t absl::lts_20250127::hash_internal::MixingHashState::CombineLargeContiguousImpl32
                   (uint64_t state,uchar *first,size_t len)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  size_t sVar3;
  uint64_t uVar4;
  undefined8 local_40;
  size_t len_local;
  uchar *first_local;
  uint64_t state_local;
  MultType m;
  
  local_40 = len;
  len_local = (size_t)first;
  first_local = (uchar *)state;
  while( true ) {
    sVar3 = PiecewiseChunkSize();
    if (local_40 < sVar3) break;
    sVar3 = PiecewiseChunkSize();
    uVar2 = CityHash32((char *)len_local,sVar3);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)first_local ^ (ulong)uVar2;
    first_local = (uchar *)(SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),0) ^
                           SUB168(auVar1 * ZEXT816(0xdcb22ca68cb134ed),8));
    sVar3 = PiecewiseChunkSize();
    local_40 = local_40 - sVar3;
    sVar3 = PiecewiseChunkSize();
    len_local = sVar3 + len_local;
  }
  uVar4 = CombineContiguousImpl(first_local,len_local,local_40);
  return uVar4;
}

Assistant:

uint64_t MixingHashState::CombineLargeContiguousImpl32(
    uint64_t state, const unsigned char* first, size_t len) {
  while (len >= PiecewiseChunkSize()) {
    state = Mix(
        state ^ hash_internal::CityHash32(reinterpret_cast<const char*>(first),
                                          PiecewiseChunkSize()),
        kMul);
    len -= PiecewiseChunkSize();
    first += PiecewiseChunkSize();
  }
  // Handle the remainder.
  return CombineContiguousImpl(state, first, len,
                               std::integral_constant<int, 4>{});
}